

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JumpConditionalStatement.cpp
# Opt level: O2

void __thiscall
IRT::JumpConditionalStatement::JumpConditionalStatement
          (JumpConditionalStatement *this,LogicOperatorType type,Expression *left,Expression *right,
          Label *label_true,Label *label_false)

{
  (this->super_Statement).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__JumpConditionalStatement_00161d90;
  this->operator_type_ = type;
  std::__cxx11::string::string((string *)&this->label_true_,(string *)label_true);
  std::__cxx11::string::string((string *)&this->label_false_,(string *)label_false);
  this->left_operand_ = left;
  this->right_operand_ = right;
  return;
}

Assistant:

JumpConditionalStatement::JumpConditionalStatement(LogicOperatorType type,
                                                   Expression *left,
                                                   Expression *right,
                                                   Label label_true,
                                                   Label label_false)
    : operator_type_(type),
      left_operand_(left),
      right_operand_(right),
      label_true_(label_true),
      label_false_(label_false) {}